

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

Test * ParserTestNoExplicitOutput::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestNoExplicitOutput((ParserTestNoExplicitOutput *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, NoExplicitOutput) {
  ManifestParser parser(&state, NULL);
  string err;
  EXPECT_TRUE(parser.ParseTest(
"rule cat\n"
"  command = cat $in > $out\n"
"build | imp : cat bar\n", &err));
}